

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

bool __thiscall
flatbuffers::Table::VerifyOffsetRequired<unsigned_int>
          (Table *this,Verifier *verifier,voffset_t field)

{
  size_t sVar1;
  
  if ((field < *(ushort *)(this + -(long)*(int *)this)) &&
     (*(voffset_t *)(this + ((ulong)field - (long)*(int *)this)) != 0)) {
    sVar1 = VerifierTemplate<false>::VerifyOffset<unsigned_int>
                      (verifier,(uint8_t *)this,
                       *(voffset_t *)(this + ((ulong)field - (long)*(int *)this)));
    return sVar1 != 0;
  }
  return false;
}

Assistant:

bool VerifyOffsetRequired(const Verifier &verifier, voffset_t field) const {
    auto field_offset = GetOptionalFieldOffset(field);
    return verifier.Check(field_offset != 0) &&
           verifier.VerifyOffset<OffsetT>(data_, field_offset);
  }